

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::build_layer_box
          (three_dim_model *this,int *layer_number,IntPoint *a,IntPoint *b,IntPoint *c,IntPoint *d,
          geofile *generated_geofile)

{
  ulong uVar1;
  IntPoint *pIVar2;
  three_dim_model *ptVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  allocator_type local_445;
  uint local_444;
  _Vector_base<int,_std::allocator<int>_> local_440;
  ulong local_428;
  undefined1 local_420 [16];
  pointer local_410;
  pointer local_408;
  double local_400;
  IntPoint *local_3f8;
  int local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  IntPoint *local_3b8;
  IntPoint *local_3b0;
  IntPoint *local_3a8;
  uint local_39c;
  int local_398;
  int local_394;
  uint local_390;
  int local_38c;
  three_dim_model *local_388;
  ulong local_380;
  map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_> lines_map;
  uint local_348;
  uint local_344;
  undefined8 local_340;
  int local_338;
  int local_334;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  points_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> plane_surfaces_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  curve_loops_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> volumes_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  surface_loops_map;
  geofile base_shape;
  
  local_3f8 = b;
  local_3b8 = c;
  local_3b0 = d;
  pmVar5 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  iVar12 = pmVar5->z_start;
  pmVar5 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  local_3ec = pmVar5->thickness;
  GEO::geofile::geofile(&base_shape);
  GEO::geofile::switch_to_OpenCASCADE(&base_shape);
  points_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &points_map._M_t._M_impl.super__Rb_tree_header._M_header;
  points_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  points_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  points_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lines_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &lines_map._M_t._M_impl.super__Rb_tree_header._M_header;
  lines_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lines_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header;
  curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header;
  plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header;
  surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  volumes_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &volumes_map._M_t._M_impl.super__Rb_tree_header._M_header;
  volumes_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  volumes_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = this->pnt_cnt;
  local_3d0 = (ulong)(uint)this->ln_cnt;
  local_380 = (ulong)(uint)this->ps_cnt;
  local_428 = (ulong)(uint)this->cl_cnt;
  local_394 = this->sl_cnt;
  iVar9 = this->vol_cnt;
  local_420._8_8_ = (undefined8)a->X;
  local_410 = (pointer)(double)a->Y;
  local_408 = (pointer)(double)iVar12;
  local_400 = this->model_default_char_length;
  local_444 = uVar7 + 1;
  local_420._0_4_ = local_444;
  local_3e8 = local_408;
  lines_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       lines_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  points_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       points_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  volumes_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       volumes_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)local_3f8->X;
  local_410 = (pointer)(double)local_3f8->Y;
  local_400 = this->model_default_char_length;
  uVar6 = uVar7 + 2;
  local_408 = local_3e8;
  local_420._0_4_ = uVar6;
  local_398 = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)local_3b8->X;
  local_410 = (pointer)(double)local_3b8->Y;
  local_400 = this->model_default_char_length;
  uVar10 = uVar7 + 3;
  local_408 = local_3e8;
  local_420._0_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)local_3b0->X;
  local_410 = (pointer)(double)local_3b0->Y;
  local_400 = this->model_default_char_length;
  uVar13 = uVar7 + 4;
  local_408 = local_3e8;
  local_420._0_4_ = uVar13;
  local_3c8 = (ulong)uVar7;
  local_3a8 = a;
  local_38c = iVar12;
  local_388 = this;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  iVar12 = (int)local_3d0;
  local_3c0 = (ulong)local_444;
  local_420._4_4_ = local_444;
  local_420._0_4_ = iVar12 + 1U;
  local_420._8_4_ = uVar6;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_420._0_4_ = iVar12 + 2;
  local_420._4_4_ = uVar6;
  local_420._8_4_ = uVar10;
  local_390 = iVar12 + 1U;
  local_328 = (ulong)uVar6;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_420._0_4_ = iVar12 + 3;
  local_420._4_4_ = uVar10;
  local_420._8_4_ = uVar13;
  local_320 = (ulong)uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_420._8_4_ = (undefined4)local_3c0;
  local_420._0_4_ = iVar12 + 4U;
  local_420._4_4_ = uVar13;
  local_330 = (ulong)uVar13;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_348 = local_444;
  local_340 = CONCAT44(uVar13,uVar10);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_348;
  local_39c = iVar12 + 4U;
  local_344 = uVar6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l,&local_445);
  pIVar2 = local_3b0;
  local_420._0_4_ = (int)local_428 + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  ptVar3 = local_388;
  uVar1 = local_3c8;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar9 = (int)local_380 + 1;
  local_420._0_4_ = iVar9;
  local_420._4_4_ = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  local_420._8_8_ = (undefined8)local_3a8->X;
  local_410 = (pointer)(double)local_3a8->Y;
  local_408 = (pointer)(double)(local_3ec + local_38c);
  local_400 = ptVar3->model_default_char_length;
  iVar12 = (int)uVar1;
  local_444 = iVar12 + 5;
  local_420._0_4_ = local_444;
  local_3e8 = local_408;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)local_3f8->X;
  local_410 = (pointer)(double)local_3f8->Y;
  local_400 = ptVar3->model_default_char_length;
  uVar10 = iVar12 + 6;
  local_408 = local_3e8;
  local_420._0_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)local_3b8->X;
  local_410 = (pointer)(double)local_3b8->Y;
  local_400 = ptVar3->model_default_char_length;
  local_420._0_4_ = iVar12 + 7;
  local_408 = local_3e8;
  local_3f8._0_4_ = local_420._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  local_420._8_8_ = (undefined8)pIVar2->X;
  local_410 = (pointer)(double)pIVar2->Y;
  local_400 = ptVar3->model_default_char_length;
  local_420._0_4_ = iVar12 + 8;
  local_3c8 = (ulong)(uint)local_420._0_4_;
  local_408 = local_3e8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&points_map,(pair<const_int,_GEO::point> *)local_420);
  uVar7 = local_444;
  local_3a8 = (IntPoint *)CONCAT44(local_3a8._4_4_,iVar9);
  iVar12 = (int)local_3d0;
  local_420._0_4_ = iVar12 + 5;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,uVar10);
  local_420._4_4_ = local_444;
  local_420._8_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  uVar6 = (uint)local_3f8;
  local_420._0_4_ = iVar12 + 6;
  local_3b0 = (IntPoint *)CONCAT44(local_3b0._4_4_,local_420._0_4_);
  local_420._8_4_ = (uint)local_3f8;
  local_420._4_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_420._0_4_ = iVar12 + 7;
  iVar9 = (int)local_3c8;
  local_3b8 = (IntPoint *)(local_3c8 << 0x20);
  local_420._4_4_ = uVar6;
  local_420._8_4_ = (int)local_3c8;
  local_3ec = local_420._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_420._0_4_ = iVar12 + 8;
  local_420._4_4_ = iVar9;
  local_420._8_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  uVar4 = local_320;
  local_348 = local_444;
  local_344 = (int)local_3e8;
  local_340 = CONCAT44((int)local_3c8,(uint)local_3f8);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_348;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_00,&local_445);
  uVar1 = local_380;
  local_420._0_4_ = (int)local_428 + 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar12 = (int)uVar1;
  local_420._0_4_ = iVar12 + 2;
  local_3f8 = (IntPoint *)CONCAT44(local_3f8._4_4_,local_420._0_4_);
  local_420._4_4_ = local_420._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  iVar9 = (int)local_3d0;
  local_444 = iVar9 + 9;
  local_420._8_4_ = uVar7 | (uint)(local_3c0 >> 0x20);
  local_420._4_4_ = (undefined4)local_3c0;
  local_420._0_4_ = local_444;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  uVar7 = iVar9 + 10;
  local_420._8_4_ = uVar10 | (uint)(local_328 >> 0x20);
  local_420._4_4_ = (undefined4)local_328;
  local_420._0_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_348 = local_390;
  uStack_3e0 = 0;
  local_340 = CONCAT44(-9 - iVar9,-5 - iVar9);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_348;
  local_344 = uVar7;
  local_3e8._0_4_ = iVar9;
  local_3e8._4_4_ = iVar9;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_01,&local_445);
  local_420._0_4_ = (int)local_428 + 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar9 = iVar12 + 3;
  local_420._0_4_ = iVar9;
  local_420._4_4_ = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  uVar10 = (int)local_3d0 + 0xb;
  local_420._8_4_ = uVar6 | (uint)(uVar4 >> 0x20);
  local_420._4_4_ = (undefined4)uVar4;
  local_420._0_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_3c0 = CONCAT44(local_3c0._4_4_,iVar9);
  local_344 = local_3b0._0_4_;
  local_340 = CONCAT44(-2 - local_3e8._4_4_,-0xb - (int)local_3e8);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_348;
  local_348 = uVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_02,&local_445);
  uVar1 = local_330;
  local_420._0_4_ = (int)local_428 + 4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar11 = iVar12 + 4;
  local_420._0_4_ = iVar11;
  local_420._4_4_ = iVar11;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  iVar9 = (int)local_3d0;
  local_420._4_4_ = (undefined4)((ulong)local_3b8 | uVar1);
  local_420._8_4_ = (undefined4)(((ulong)local_3b8 | uVar1) >> 0x20);
  local_420._0_4_ = iVar9 + 0xc;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&lines_map,(pair<const_int,_GEO::line> *)local_420);
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,iVar9 + 0xc);
  local_344 = local_3ec;
  local_340 = CONCAT44(-3 - iVar9,-0xc - iVar9);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_348;
  local_348 = uVar10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_03,&local_445);
  local_420._0_4_ = (int)local_428 + 5;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar8 = iVar12 + 5;
  local_420._0_4_ = iVar8;
  local_420._4_4_ = iVar8;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  local_348 = local_39c;
  local_344 = local_444;
  local_340 = CONCAT44(-0xc - iVar9,-8 - (int)local_3d0);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_348;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_04,&local_445);
  local_420._0_4_ = (int)local_428 + 6;
  local_428 = (ulong)(uint)local_420._0_4_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  ptVar3 = local_388;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&curve_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar12 = iVar12 + 6;
  local_420._0_4_ = iVar12;
  local_420._4_4_ = iVar12;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&plane_surfaces_map,(pair<const_int,_int> *)local_420);
  local_348 = (uint)local_3a8;
  local_344 = (uint)local_3f8;
  local_340 = CONCAT44(iVar11,(int)local_3c0);
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)&local_348;
  local_338 = iVar8;
  local_334 = iVar12;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_440,__l_05,&local_445);
  iVar9 = local_394 + 1;
  local_420._0_4_ = iVar9;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_420 + 8),
             (vector<int,_std::allocator<int>_> *)&local_440);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&surface_loops_map,
             (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_420);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_420 + 8));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  iVar8 = local_398 + 1;
  local_420._0_4_ = iVar8;
  local_420._4_4_ = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&volumes_map,(pair<const_int,_int> *)local_420);
  GEO::geofile::insert_points_map(&base_shape,&points_map);
  uVar1 = local_3c8;
  GEO::geofile::insert_lines_map(&base_shape,&lines_map);
  GEO::geofile::insert_curve_loops_map(&base_shape,&curve_loops_map);
  GEO::geofile::insert_plane_surfaces_map(&base_shape,&plane_surfaces_map);
  GEO::geofile::insert_surface_loops_map(&base_shape,&surface_loops_map);
  GEO::geofile::insert_volumes_map(&base_shape,&volumes_map);
  GEO::geofile::disable_char_len(&base_shape);
  GEO::geofile::operator=(generated_geofile,&base_shape);
  ptVar3->pnt_cnt = (int)uVar1;
  ptVar3->ln_cnt = (int)local_3e8;
  ptVar3->cl_cnt = (int)local_428;
  ptVar3->ps_cnt = iVar12;
  ptVar3->sl_cnt = iVar9;
  ptVar3->vol_cnt = iVar8;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&volumes_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&surface_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&plane_surfaces_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&curve_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  ::~_Rb_tree(&lines_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  ::~_Rb_tree(&points_map._M_t);
  GEO::geofile::~geofile(&base_shape);
  return;
}

Assistant:

void MODEL3D::three_dim_model::build_layer_box(
 const int &layer_number,
const ClipperLib::IntPoint &a,
const ClipperLib::IntPoint &b,
const ClipperLib::IntPoint &c,
const ClipperLib::IntPoint &d,
GEO::geofile &generated_geofile )
{
    int base_height = proc_info_map[layer_number].z_start;
    int thickness = proc_info_map[layer_number].thickness;
    GEO::geofile base_shape;
    base_shape.switch_to_OpenCASCADE();
    std::map<int, GEO::point> points_map;
    std::map<int, GEO::line> lines_map;
    std::map<int, std::vector<int>> curve_loops_map;
    std::map<int, int> plane_surfaces_map;
    std::map<int, std::vector<int>> surface_loops_map;
    std::map<int, int> volumes_map;
    GEO::point one, two, three, four, five, six, seven, eight;
    int point_count = pnt_cnt;
    int line_count = ln_cnt;
    int plane_sur_count = ps_cnt;
    int cur_loop_count = cl_cnt;
    int sur_loop_count = sl_cnt;
    int vol_count = vol_cnt;
    //------- bottom --------
    one.x   = a.X;
    one.y   = a.Y;
    one.z   = base_height;
    one.char_len = model_default_char_length;
    points_map.insert({++point_count, one});
    two.x   = b.X;
    two.y   = b.Y;
    two.z   = base_height;
    two.char_len = model_default_char_length;
    points_map.insert({++point_count, two});
    three.x = c.X;
    three.y = c.Y;
    three.z = base_height;
    three.char_len = model_default_char_length;
    points_map.insert({++point_count, three});
    four.x  = d.X;
    four.y  = d.Y;
    four.z  = base_height;
    four.char_len = model_default_char_length;
    points_map.insert({++point_count, four});
    GEO::line in_line;
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {(point_count-3), (point_count-2), (point_count-1), point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    //-------- top ---------
    five.x   = a.X;
    five.y   = a.Y;
    five.z   = base_height + thickness;
    five.char_len = model_default_char_length;
    points_map.insert({++point_count, five});
    six.x    = b.X;
    six.y    = b.Y;
    six.z    = base_height + thickness;
    six.char_len = model_default_char_length;
    points_map.insert({++point_count, six});
    seven.x  = c.X;
    seven.y  = c.Y;
    seven.z  = base_height + thickness;
    seven.char_len = model_default_char_length;
    points_map.insert({++point_count, seven});
    eight.x  = d.X;
    eight.y  = d.Y;
    eight.z  = base_height + thickness;
    eight.char_len = model_default_char_length;
    points_map.insert({++point_count, eight});
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {point_count-3,point_count-2,point_count-1,point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 1;
    in_line.start = point_count-7;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-6;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-9,line_count,-(line_count-5),-(line_count-1)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 2;
    in_line.start = point_count-5;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 3;
    in_line.start = point_count-4;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 4;
    curve_loops_map.insert({++cur_loop_count, {line_count-8,line_count-3,-(line_count-4),-line_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // enclose
    surface_loops_map.insert({++sur_loop_count, {plane_sur_count-5,plane_sur_count-4,
                                                 plane_sur_count-3,plane_sur_count-2,
                                                 plane_sur_count-1, plane_sur_count}});
    volumes_map.insert({++vol_count, sur_loop_count});
    base_shape.insert_points_map(points_map);
    base_shape.insert_lines_map(lines_map);
    base_shape.insert_curve_loops_map(curve_loops_map);
    base_shape.insert_plane_surfaces_map(plane_surfaces_map);
    base_shape.insert_surface_loops_map(surface_loops_map);
    base_shape.insert_volumes_map(volumes_map);
    base_shape.disable_char_len();
    generated_geofile = base_shape;
    pnt_cnt = point_count;
    ln_cnt = line_count;
    cl_cnt = cur_loop_count;
    ps_cnt = plane_sur_count;
    sl_cnt = sur_loop_count;
    vol_cnt = vol_count;
    // std::string output_path = "data/3DGen/" +
    // std::to_string(layer_number) + "_P_0.geo";
    // base_shape.export_geofile(output_path); //For debugging
    // __asm("nop");
}